

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-hash.c
# Opt level: O1

void uint_hash_clear(uint_hash *h)

{
  uint_hash_entry **ppuVar1;
  uint_hash_entry *puVar2;
  ulong uVar3;
  
  if (((h != (uint_hash *)0x0) && (h->table != (uint_hash_entry **)0x0)) && (h->slots != 0)) {
    uVar3 = 0;
    do {
      ppuVar1 = h->table;
      while (puVar2 = ppuVar1[uVar3], puVar2 != (uint_hash_entry *)0x0) {
        ppuVar1[uVar3] = puVar2->next;
        h->size = h->size - 1;
        if (puVar2->value != (void *)0x0) {
          if (h->dtor != (Curl_uint_hash_dtor *)0x0) {
            (*h->dtor)(puVar2->id,puVar2->value);
          }
          puVar2->value = (void *)0x0;
        }
        (*Curl_cfree)(puVar2);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < h->slots);
  }
  return;
}

Assistant:

static void uint_hash_clear(struct uint_hash *h)
{
  if(h && h->table) {
    struct uint_hash_entry *he, **he_anchor;
    size_t i;
    DEBUGASSERT(h->init == CURL_UINTHASHINIT);
    for(i = 0; i < h->slots; ++i) {
      he_anchor = &h->table[i];
      while(*he_anchor) {
        he = *he_anchor;
        uint_hash_entry_unlink(h, he_anchor, he);
        uint_hash_entry_destroy(h, he);
      }
    }
  }
}